

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPrint.c
# Opt level: O1

void Fxu_MatrixPrint(FILE *pFile,Fxu_Matrix *p)

{
  Fxu_Cube *pFVar1;
  Fxu_Single *pFVar2;
  FILE *__stream;
  Fxu_Var *pFVar3;
  int iVar4;
  long lVar5;
  Fxu_Double *pFVar6;
  Fxu_Lit *pFVar7;
  Fxu_Pair *pFVar8;
  
  __stream = (FILE *)pFile;
  if (pFile == (FILE *)0x0) {
    __stream = fopen("matrix.txt","w");
  }
  fprintf(__stream,"Matrix has %d vars, %d cubes, %d literals, %d divisors.\n",
          (ulong)(uint)(p->lVars).nItems,(ulong)(uint)(p->lCubes).nItems,(ulong)(uint)p->nEntries,
          (ulong)(uint)p->nDivs);
  fprintf(__stream,"Divisors selected so far: single = %d, double = %d.\n",(ulong)(uint)p->nDivs1,
          (ulong)(uint)p->nDivs2);
  fputc(10,__stream);
  iVar4 = 0xc;
  do {
    fputc(0x20,__stream);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  for (pFVar3 = (p->lVars).pHead; pFVar3 != (Fxu_Var *)0x0; pFVar3 = pFVar3->pNext) {
    fprintf(__stream,"%d",(ulong)(uint)(pFVar3->iVar % 10));
  }
  fputc(10,__stream);
  for (pFVar1 = (p->lCubes).pHead; pFVar1 != (Fxu_Cube *)0x0; pFVar1 = pFVar1->pNext) {
    iVar4 = 0;
    fprintf(__stream,"%4d",(ulong)(uint)pFVar1->iCube);
    fwrite("  ",2,1,__stream);
    fprintf(__stream,"%4d",(ulong)(uint)pFVar1->pVar->iVar);
    fwrite("  ",2,1,__stream);
    pFVar7 = (pFVar1->lLits).pHead;
    if (pFVar7 == (Fxu_Lit *)0x0) goto LAB_0043e515;
    iVar4 = -1;
    do {
      while (iVar4 = iVar4 + 1, iVar4 < pFVar7->pVar->iVar) {
        fputc(0x2e,__stream);
      }
      fputc(0x31,__stream);
      pFVar7 = pFVar7->pHNext;
    } while (pFVar7 != (Fxu_Lit *)0x0);
    while( true ) {
      iVar4 = iVar4 + 1;
LAB_0043e515:
      if ((p->lVars).nItems <= iVar4) break;
      fputc(0x2e,__stream);
    }
    fputc(10,__stream);
  }
  fputc(10,__stream);
  fwrite("The double divisors are:\n",0x19,1,__stream);
  if (0 < p->nTableSize) {
    lVar5 = 0;
    do {
      for (pFVar6 = p->pTable[lVar5].pHead; pFVar6 != (Fxu_Double *)0x0; pFVar6 = pFVar6->pNext) {
        pFVar8 = (pFVar6->lPairs).pHead;
        fprintf(__stream,"Divisor #%3d (lit=%d,%d) (w=%2d):  ",(ulong)(uint)pFVar6->Num,
                (ulong)(uint)pFVar8->nLits1,(ulong)(uint)pFVar8->nLits2,(ulong)(uint)pFVar6->Weight)
        ;
        for (pFVar8 = (pFVar6->lPairs).pHead; pFVar8 != (Fxu_Pair *)0x0; pFVar8 = pFVar8->pDNext) {
          fprintf(__stream," <%d, %d> (b=%d)",(ulong)(uint)pFVar8->pCube1->iCube,
                  (ulong)(uint)pFVar8->pCube2->iCube,(ulong)(uint)pFVar8->nBase);
        }
        fputc(10,__stream);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->nTableSize);
  }
  fputc(10,__stream);
  fwrite("The cubes are:\n",0xf,1,__stream);
  for (pFVar1 = (p->lCubes).pHead; pFVar1 != (Fxu_Cube *)0x0; pFVar1 = pFVar1->pNext) {
    fprintf(__stream,"Cube #%3d: ",(ulong)(uint)pFVar1->iCube);
    if ((pFVar1->pVar->ppPairs != (Fxu_Pair ***)0x0) && (pFVar3 = pFVar1->pVar, 0 < pFVar3->nCubes))
    {
      lVar5 = 0;
      do {
        pFVar8 = pFVar3->ppPairs[pFVar1->iCube][lVar5];
        if (pFVar8 != (Fxu_Pair *)0x0) {
          fprintf(__stream," <%d %d> (d=%d) (b=%d)",(ulong)(uint)pFVar8->iCube1,
                  (ulong)(uint)pFVar8->iCube2,(ulong)(uint)pFVar8->pDiv->Num,
                  (ulong)(uint)pFVar8->nBase);
        }
        lVar5 = lVar5 + 1;
        pFVar3 = pFVar1->pVar;
      } while (lVar5 < pFVar3->nCubes);
    }
    fputc(10,__stream);
  }
  fputc(10,__stream);
  fwrite("The single divisors are:\n",0x19,1,__stream);
  for (pFVar2 = (p->lSingles).pHead; pFVar2 != (Fxu_Single *)0x0; pFVar2 = pFVar2->pNext) {
    fprintf(__stream,"Single-cube divisor #%5d: Var1 = %4d. Var2 = %4d. Weight = %2d\n",
            (ulong)(uint)pFVar2->Num,(ulong)(uint)pFVar2->pVar1->iVar,
            (ulong)(uint)pFVar2->pVar2->iVar,(ulong)(uint)pFVar2->Weight);
  }
  fputc(10,__stream);
  if (pFile != (FILE *)0x0) {
    return;
  }
  fclose(__stream);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Fxu_MatrixPrint( FILE * pFile, Fxu_Matrix * p )
{
	Fxu_Var * pVar;
	Fxu_Cube * pCube;
	Fxu_Double * pDiv;
    Fxu_Single * pSingle;
	Fxu_Lit * pLit;
	Fxu_Pair * pPair;
	int i, LastNum;
	int fStdout;

	fStdout = 1;
	if ( pFile == NULL )
	{
		pFile = fopen( "matrix.txt", "w" );
		fStdout = 0;
	}

	fprintf( pFile, "Matrix has %d vars, %d cubes, %d literals, %d divisors.\n", 
		p->lVars.nItems, p->lCubes.nItems, p->nEntries, p->nDivs );
	fprintf( pFile, "Divisors selected so far: single = %d, double = %d.\n", 
		p->nDivs1, p->nDivs2 );
	fprintf( pFile, "\n" );

	// print the numbers on top of the matrix
	for ( i = 0; i < 12; i++ )
		fprintf( pFile, " " );
	Fxu_MatrixForEachVariable( p, pVar )
		fprintf( pFile, "%d", pVar->iVar % 10 );
	fprintf( pFile, "\n" );

	// print the rows
	Fxu_MatrixForEachCube( p, pCube )
	{
		fprintf( pFile, "%4d", pCube->iCube );
		fprintf( pFile, "  " );
		fprintf( pFile, "%4d", pCube->pVar->iVar );
		fprintf( pFile, "  " );

		// print the literals
		LastNum = -1;
		Fxu_CubeForEachLiteral( pCube, pLit )
		{
			for ( i = LastNum + 1; i < pLit->pVar->iVar; i++ )
				fprintf( pFile, "." );
			fprintf( pFile, "1" );
			LastNum = i;
		}
		for ( i = LastNum + 1; i < p->lVars.nItems; i++ )
			fprintf( pFile, "." );
		fprintf( pFile, "\n" );
	}
	fprintf( pFile, "\n" );

	// print the double-cube divisors
	fprintf( pFile, "The double divisors are:\n" );
	Fxu_MatrixForEachDouble( p, pDiv, i )
	{
		fprintf( pFile, "Divisor #%3d (lit=%d,%d) (w=%2d):  ", 
			pDiv->Num, pDiv->lPairs.pHead->nLits1, 
            pDiv->lPairs.pHead->nLits2, pDiv->Weight );
		Fxu_DoubleForEachPair( pDiv, pPair )
			fprintf( pFile, " <%d, %d> (b=%d)", 
				pPair->pCube1->iCube, pPair->pCube2->iCube, pPair->nBase );
		fprintf( pFile, "\n" );
	}
    fprintf( pFile, "\n" );

	// print the divisors associated with each cube
	fprintf( pFile, "The cubes are:\n" );
	Fxu_MatrixForEachCube( p, pCube )
	{
		fprintf( pFile, "Cube #%3d: ", pCube->iCube );
        if ( pCube->pVar->ppPairs )
        {
		    Fxu_CubeForEachPair( pCube, pPair, i )
				fprintf( pFile, " <%d %d> (d=%d) (b=%d)", 
					pPair->iCube1, pPair->iCube2, pPair->pDiv->Num, pPair->nBase );
        }
		fprintf( pFile, "\n" );
	}
    fprintf( pFile, "\n" );

	// print the single-cube divisors
	fprintf( pFile, "The single divisors are:\n" );
	Fxu_MatrixForEachSingle( p, pSingle )
	{
		fprintf( pFile, "Single-cube divisor #%5d: Var1 = %4d. Var2 = %4d. Weight = %2d\n", 
			pSingle->Num, pSingle->pVar1->iVar, pSingle->pVar2->iVar, pSingle->Weight );
	}
    fprintf( pFile, "\n" );

/*
    {
        int Index;
		fprintf( pFile, "Distribution of divisors in the hash table:\n" );
        for ( Index = 0; Index < p->nTableSize; Index++ )
            fprintf( pFile, " %d", p->pTable[Index].nItems );
		fprintf( pFile, "\n" );
    }
*/
	if ( !fStdout )
		fclose( pFile );
}